

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O1

void cdef_filter_16_3_sse4_1
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  ulong uVar6;
  
  if (block_width == 8) {
    if (0 < block_height) {
      uVar6 = 0;
      do {
        uVar2 = *(undefined8 *)(in + 4);
        uVar3 = *(undefined8 *)(in + 0x90);
        uVar4 = *(undefined8 *)(in + 0x94);
        *(undefined8 *)dest = *(undefined8 *)in;
        *(undefined8 *)((long)dest + 8) = uVar2;
        puVar1 = (undefined8 *)((long)dest + (long)dstride * 2);
        *puVar1 = uVar3;
        puVar1[1] = uVar4;
        uVar6 = uVar6 + 2;
        in = in + 0x120;
        dest = (void *)((long)dest + (long)dstride * 4);
      } while (uVar6 < (uint)block_height);
    }
  }
  else if (0 < block_height) {
    lVar5 = (long)dstride;
    uVar6 = 0;
    do {
      uVar2 = *(undefined8 *)(in + 0x90);
      uVar3 = *(undefined8 *)(in + 0x120);
      uVar4 = *(undefined8 *)(in + 0x1b0);
      *(undefined8 *)dest = *(undefined8 *)in;
      *(undefined8 *)((long)dest + lVar5 * 2) = uVar2;
      *(undefined8 *)((long)dest + lVar5 * 4) = uVar3;
      *(undefined8 *)((long)dest + lVar5 * 6) = uVar4;
      uVar6 = uVar6 + 4;
      in = in + 0x240;
      dest = (void *)((long)dest + lVar5 * 8);
    } while (uVar6 < (uint)block_height);
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_16_3)(void *dest, int dstride, const uint16_t *in,
                                 int pri_strength, int sec_strength, int dir,
                                 int pri_damping, int sec_damping,
                                 int coeff_shift, int block_width,
                                 int block_height) {
  (void)pri_strength;
  (void)sec_strength;
  (void)dir;
  (void)pri_damping;
  (void)sec_damping;
  (void)coeff_shift;
  (void)block_width;
  if (block_width == 8) {
    copy_block_8xh(/*is_lowbd=*/0, dest, dstride, in, block_height);
  } else {
    copy_block_4xh(/*is_lowbd=*/0, dest, dstride, in, block_height);
  }
}